

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimizer_engine_test.cpp
# Opt level: O1

void __thiscall
ram::test::RamMinimizerEngineTest_Map_Test::TestBody(RamMinimizerEngineTest_Map_Test *this)

{
  pointer pOVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> o;
  MinimizerEngine me;
  AssertHelper local_d8;
  vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> local_d0;
  undefined1 local_b8 [32];
  AssertHelper local_98;
  vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  MinimizerEngine local_68;
  
  local_78._M_allocated_capacity = 0;
  local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  MinimizerEngine::MinimizerEngine
            (&local_68,(shared_ptr<thread_pool::ThreadPool> *)&local_78,0xf,5,500,4,100,10000);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  MinimizerEngine::Minimize
            (&local_68,
             (this->super_RamMinimizerEngineTest).s.
             super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->super_RamMinimizerEngineTest).s.
             super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,false);
  MinimizerEngine::Filter(&local_68,0.001);
  pcVar4 = (char *)0x0;
  MinimizerEngine::Map
            (&local_90,&local_68,
             (this->super_RamMinimizerEngineTest).s.
             super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,true,true,false,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  local_d8.data_._0_4_ = 1;
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)local_90.
                       super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_90.
                       super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 6);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_b8,"1","o.size()",(int *)&local_d8,(unsigned_long *)&local_d0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_d0.
                        super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"0","o.front().lhs_id",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->lhs_id);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x1e);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"30","o.front().lhs_begin",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->lhs_begin);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x21,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x74d);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"1869","o.front().lhs_end",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->lhs_end);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x22,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"1","o.front().rhs_id",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->rhs_id);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_d0.
                        super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"0","o.front().rhs_begin",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->rhs_begin);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x24,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x765);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"1893","o.front().rhs_end",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->rhs_end);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x25,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x249);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"585","o.front().score",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->score);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x26,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)local_b8._8_8_);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         (local_90.
                          super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                          _M_impl.super__Vector_impl_data._M_start)->strand);
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_start)->strand == false) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)&local_d0,(AssertionResult *)"o.front().strand",
               "false","true",pcVar4);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x27,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_);
    }
    if ((long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_) + 8))();
    }
  }
  pOVar1 = local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if ((uint32_t *)
        *(undefined1 **)
         local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        &(local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
          super__Vector_impl_data._M_finish)->rhs_begin) {
      operator_delete(*(undefined1 **)
                       local_d0.
                       super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(pOVar1);
  }
  pcVar4 = (char *)0x0;
  MinimizerEngine::Map
            (&local_d0,&local_68,
             (this->super_RamMinimizerEngineTest).s.
             super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1,true,true,false,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  local_b8._16_8_ =
       local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_b8._8_8_ =
       local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b8._0_8_ =
       local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::~vector
            ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)local_b8);
  std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::~vector(&local_d0);
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_90.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start ==
                         local_90.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)&local_d0,(AssertionResult *)"o.empty()","false",
               "true",pcVar4);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x2a,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
    if ((long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_) + 8))();
    }
  }
  pOVar1 = local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if ((uint32_t *)
        *(undefined1 **)
         local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        &(local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
          super__Vector_impl_data._M_finish)->rhs_begin) {
      operator_delete(*(undefined1 **)
                       local_d0.
                       super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(pOVar1);
  }
  pcVar4 = (char *)0x0;
  MinimizerEngine::Map
            (&local_d0,&local_68,
             (this->super_RamMinimizerEngineTest).s.
             super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1,true,false,false,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  local_b8._16_8_ =
       local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_b8._8_8_ =
       local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b8._0_8_ =
       local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::~vector
            ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)local_b8);
  std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::~vector(&local_d0);
  local_d8.data_._0_4_ = 1;
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)local_90.
                       super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_90.
                       super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 6);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_b8,"1","o.size()",(int *)&local_d8,(unsigned_long *)&local_d0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x2d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"1","o.front().lhs_id",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->lhs_id);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x2e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_d0.
                        super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"0","o.front().lhs_begin",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->lhs_begin);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x2f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x765);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"1893","o.front().lhs_end",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->lhs_end);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x30,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_d0.
                        super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"0","o.front().rhs_id",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->rhs_id);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x31,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x1e);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"30","o.front().rhs_begin",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->rhs_begin);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x32,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x74d);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"1869","o.front().rhs_end",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->rhs_end);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x33,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x249);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"585","o.front().score",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->score);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x34,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         (local_90.
                          super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                          _M_impl.super__Vector_impl_data._M_start)->strand);
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_start)->strand == false) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)&local_d0,(AssertionResult *)"o.front().strand",
               "false","true",pcVar4);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x35,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
    if ((long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_) + 8))();
    }
  }
  pOVar1 = local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if ((uint32_t *)
        *(undefined1 **)
         local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        &(local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
          super__Vector_impl_data._M_finish)->rhs_begin) {
      operator_delete(*(undefined1 **)
                       local_d0.
                       super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(pOVar1);
  }
  pcVar4 = (char *)0x0;
  MinimizerEngine::Map
            (&local_d0,&local_68,
             (this->super_RamMinimizerEngineTest).s.
             super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,false,true,false,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  local_b8._16_8_ =
       local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_b8._8_8_ =
       local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b8._0_8_ =
       local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::~vector
            ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)local_b8);
  std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::~vector(&local_d0);
  local_d8.data_._0_4_ = 2;
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)local_90.
                       super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_90.
                       super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 6);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_b8,"2","o.size()",(int *)&local_d8,(unsigned_long *)&local_d0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x38,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_d0.
                        super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"0","o.front().lhs_id",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->lhs_id);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x39,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,2);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"2","o.front().lhs_begin",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->lhs_begin);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x3a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x769);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"1897","o.front().lhs_end",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->lhs_end);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_d0.
                        super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"0","o.front().rhs_id",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->rhs_id);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,2);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"2","o.front().rhs_begin",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->rhs_begin);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x3d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x769);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"1897","o.front().rhs_end",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->rhs_end);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x3e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x767);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_b8,"1895","o.front().score",(int *)&local_d0,
             &(local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
               _M_impl.super__Vector_impl_data._M_start)->score);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((pointer)local_b8._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x3f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_d0.
                            super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar2 = local_b8._8_8_;
  if ((pointer)local_b8._8_8_ != (pointer)0x0) {
    if ((uint32_t *)*(undefined1 **)local_b8._8_8_ != (uint32_t *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined1 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_d0.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         (local_90.
                          super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                          _M_impl.super__Vector_impl_data._M_start)->strand);
  local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((local_90.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
       super__Vector_impl_data._M_start)->strand == false) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)&local_d0,(AssertionResult *)"o.front().strand",
               "false","true",pcVar4);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x40,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
    if ((long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_) + 8))();
    }
  }
  pOVar1 = local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if ((uint32_t *)
        *(undefined1 **)
         local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        &(local_d0.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
          super__Vector_impl_data._M_finish)->rhs_begin) {
      operator_delete(*(undefined1 **)
                       local_d0.
                       super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(pOVar1);
  }
  std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::~vector(&local_90);
  MinimizerEngine::~MinimizerEngine(&local_68);
  return;
}

Assistant:

TEST_F(RamMinimizerEngineTest, Map) {
  MinimizerEngine me{};
  me.Minimize(s.begin(), s.end());
  me.Filter(0.001);

  auto o = me.Map(s.front(), true, true);
  EXPECT_EQ(1, o.size());
  EXPECT_EQ(0, o.front().lhs_id);
  EXPECT_EQ(30, o.front().lhs_begin);
  EXPECT_EQ(1869, o.front().lhs_end);
  EXPECT_EQ(1, o.front().rhs_id);
  EXPECT_EQ(0, o.front().rhs_begin);
  EXPECT_EQ(1893, o.front().rhs_end);
  EXPECT_EQ(585, o.front().score);
  EXPECT_TRUE(o.front().strand);

  o = me.Map(s.back(), true, true);
  EXPECT_TRUE(o.empty());

  o = me.Map(s.back(), true, false);
  EXPECT_EQ(1, o.size());
  EXPECT_EQ(1, o.front().lhs_id);
  EXPECT_EQ(0, o.front().lhs_begin);
  EXPECT_EQ(1893, o.front().lhs_end);
  EXPECT_EQ(0, o.front().rhs_id);
  EXPECT_EQ(30, o.front().rhs_begin);
  EXPECT_EQ(1869, o.front().rhs_end);
  EXPECT_EQ(585, o.front().score);
  EXPECT_TRUE(o.front().strand);

  o = me.Map(s.front(), false, true);
  EXPECT_EQ(2, o.size());
  EXPECT_EQ(0, o.front().lhs_id);
  EXPECT_EQ(2, o.front().lhs_begin);
  EXPECT_EQ(1897, o.front().lhs_end);
  EXPECT_EQ(0, o.front().rhs_id);
  EXPECT_EQ(2, o.front().rhs_begin);
  EXPECT_EQ(1897, o.front().rhs_end);
  EXPECT_EQ(1895, o.front().score);
  EXPECT_TRUE(o.front().strand);
}